

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_tvptr(ASMState *as,Reg dest,IRRef ref)

{
  IRIns *ir;
  uint uVar1;
  MCode *pMVar2;
  byte bVar3;
  Reg RVar4;
  x86Op xo;
  int32_t iVar5;
  
  ir = as->ir + ref;
  bVar3 = (ir->field_1).t.irt & 0x1f;
  if (bVar3 == 0xe) {
    if (0x7fff < ref) {
      iVar5 = ra_spill(as,ir);
      emit_rmro(as,XO_LEA,dest | 0x80200,4,iVar5);
      return;
    }
    iVar5 = (int)ir + 8;
    goto LAB_0014cf8f;
  }
  if (ref < 0x8000) {
    if (2 < bVar3) {
      pMVar2 = as->mcp;
      *(IRRef2 *)(pMVar2 + -4) = (ir->field_1).op12;
      as->mcp = pMVar2 + -4;
      xo = XO_MOVmi;
      RVar4 = 0;
      goto LAB_0014cf39;
    }
  }
  else {
    RVar4 = (Reg)(char)(ir->field_1).r;
    if ((char)(ir->field_1).r < '\0') {
      RVar4 = ra_allocref(as,ref,~(1 << (dest & 0x1f)) & 0xffef);
    }
    bVar3 = (byte)RVar4 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
    uVar1._0_2_ = *(IROpT *)((long)ir + 4);
    uVar1._2_2_ = *(IRRef1 *)((long)ir + 6);
    RVar4 = -(uint)((0x604208U >> (uVar1 & 0x1f) & 1) != 0) & 0x80200 | RVar4;
    xo = XO_MOVto;
LAB_0014cf39:
    emit_rmro(as,xo,RVar4,dest,0);
  }
  bVar3 = (ir->field_1).t.irt & 0x1f;
  if (bVar3 != 3) {
    pMVar2 = as->mcp;
    *(int *)(pMVar2 + -4) = (int)(char)~bVar3;
    as->mcp = pMVar2 + -4;
    emit_rmro(as,XO_MOVmi,0,dest,4);
  }
  iVar5 = *(int *)&as->J + -0x120;
LAB_0014cf8f:
  emit_loadi(as,dest,iVar5);
  return;
}

Assistant:

static void asm_tvptr(ASMState *as, Reg dest, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (irt_isnum(ir->t)) {
    /* For numbers use the constant itself or a spill slot as a TValue. */
    if (irref_isk(ref))
      emit_loada(as, dest, ir_knum(ir));
    else
      emit_rmro(as, XO_LEA, dest|REX_64, RID_ESP, ra_spill(as, ir));
  } else {
    /* Otherwise use g->tmptv to hold the TValue. */
#if LJ_GC64
    if (irref_isk(ref)) {
      TValue k;
      lj_ir_kvalue(as->J->L, &k, ir);
      emit_movmroi(as, dest, 4, k.u32.hi);
      emit_movmroi(as, dest, 0, k.u32.lo);
    } else {
      /* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
      Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
      if (irt_is64(ir->t)) {
	emit_u32(as, irt_toitype(ir->t) << 15);
	emit_rmro(as, XO_ARITHi, XOg_OR, dest, 4);
      } else {
	/* Currently, no caller passes integers that might end up here. */
	emit_movmroi(as, dest, 4, (irt_toitype(ir->t) << 15));
      }
      emit_movtomro(as, REX_64IR(ir, src), dest, 0);
    }
#else
    if (!irref_isk(ref)) {
      Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
      emit_movtomro(as, REX_64IR(ir, src), dest, 0);
    } else if (!irt_ispri(ir->t)) {
      emit_movmroi(as, dest, 0, ir->i);
    }
    if (!(LJ_64 && irt_islightud(ir->t)))
      emit_movmroi(as, dest, 4, irt_toitype(ir->t));
#endif
    emit_loada(as, dest, &J2G(as->J)->tmptv);
  }
}